

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution1D_x86_fma::create_pipeline(Convolution1D_x86_fma *this,Option *param_1)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  _func_int *p_Var5;
  long lVar6;
  size_t sVar7;
  size_t sVar8;
  void *pvVar9;
  int k_6;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  void *pvVar17;
  long lVar18;
  uint _c;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  undefined4 *puVar26;
  undefined4 *puVar27;
  long lVar28;
  long lVar29;
  uint _w;
  long lVar30;
  long lVar31;
  undefined4 *puVar32;
  int k_9;
  int iVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  int k_1;
  long lVar37;
  int iVar38;
  long lVar39;
  int k_3;
  long lVar40;
  ulong uVar41;
  long lVar42;
  long lVar43;
  ulong uVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  undefined4 *puVar48;
  int k;
  ulong uVar49;
  long lVar50;
  int iVar51;
  long lVar52;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_f8;
  int local_e4;
  
  p_Var5 = this->_vptr_Convolution1D_x86_fma[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var5) != 0) {
    return 0;
  }
  uVar4 = *(uint *)(&this->field_0xd4 + (long)p_Var5);
  lVar30 = (long)(int)uVar4;
  uVar19 = (long)*(int *)(&this->field_0xf0 + (long)p_Var5) / (long)(int)uVar4;
  _c = *(uint *)(&this->field_0xd0 + (long)p_Var5);
  lVar24 = (long)(int)_c;
  uVar19 = (long)((ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff) / (long)(int)_c;
  uVar44 = uVar19 & 0xffffffff;
  uVar10 = (uint)uVar19;
  uVar20 = uVar10;
  if (lVar24 < 8) {
    if ((int)_c < 4) {
      if ((int)_c < 2) {
        if ((int)uVar10 < 8) {
          if ((int)uVar10 < 4) {
            _w = uVar4;
            if (1 < (int)uVar10) {
              _w = uVar4 * 2;
              uVar20 = (uVar10 & 1) + 1;
            }
          }
          else {
            _w = uVar4 * 4;
            uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
          }
        }
        else {
          _w = uVar4 * 8;
          uVar20 = (uVar10 & 1) + (uVar10 >> 3) + ((uint)(uVar44 >> 2) & 1) +
                   (uint)((uVar10 >> 1 & 1) != 0);
        }
      }
      else if ((int)uVar10 < 8) {
        if ((int)uVar10 < 4) {
          if ((int)uVar10 < 2) {
            _c = (_c & 1) + 1;
            _w = uVar4 * 2;
            goto LAB_004987f6;
          }
          _w = uVar4 * 4;
          uVar20 = (uVar10 & 1) + 1;
        }
        else {
          uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
          _w = uVar4 * 8;
        }
        _c = (_c & 1) + 1;
      }
      else {
        _w = uVar4 << 4;
        uVar20 = (uVar10 & 1) + (uVar10 >> 3) + ((uint)(uVar44 >> 2) & 1) +
                 (uint)((uVar10 >> 1 & 1) != 0);
        _c = (_c & 1) + 1;
      }
    }
    else if ((int)uVar10 < 8) {
      if ((int)uVar10 < 4) {
        if ((int)uVar10 < 2) {
          _c = (_c & 1) + 1 + (uint)((_c >> 1 & 1) != 0);
          _w = uVar4 * 4;
          goto LAB_004987f6;
        }
        _w = uVar4 * 8;
        uVar20 = (uVar10 & 1) + 1;
      }
      else {
        _w = uVar4 << 4;
        uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
      }
      _c = (_c & 1) + 1 + (uint)((_c >> 1 & 1) != 0);
    }
    else {
      _w = uVar4 << 5;
      uVar20 = (uVar10 & 1) + (uVar10 >> 3) + ((uint)(uVar44 >> 2) & 1) +
               (uint)((uVar10 >> 1 & 1) != 0);
      _c = (_c & 1) + 1 + (uint)((_c >> 1 & 1) != 0);
    }
  }
  else {
    if ((int)uVar10 < 8) {
      if ((int)uVar10 < 4) {
        if ((int)uVar10 < 2) {
          _w = uVar4 * 8;
          _c = (_c & 1) + (_c >> 3) + (_c >> 2 & 1) + (uint)((_c >> 1 & 1) != 0);
          goto LAB_004987f6;
        }
        _w = uVar4 << 4;
        uVar20 = (uVar10 & 1) + 1;
      }
      else {
        _w = uVar4 << 5;
        uVar20 = (uVar10 & 1) + 1 + (uint)((uVar10 >> 1 & 1) != 0);
      }
    }
    else {
      _w = uVar4 << 6;
      uVar20 = (uVar10 & 1) + (uVar10 >> 3) + ((uint)((uVar19 & 0xffffffff) >> 2) & 1) +
               (uint)((uVar10 >> 1 & 1) != 0);
    }
    _c = (_c & 1) + (_c >> 3) + (_c >> 2 & 1) + (uint)((_c >> 1 & 1) != 0);
  }
LAB_004987f6:
  Mat::create(&this->weight_data_tm,_w,uVar20,_c,4,(Allocator *)0x0);
  lVar6 = *(long *)(&this->field_0x148 + (long)p_Var5);
  sVar7 = (this->weight_data_tm).elemsize;
  sVar8 = (this->weight_data_tm).cstep;
  pvVar9 = (this->weight_data_tm).data;
  iVar51 = 0;
  uVar19 = 0;
  if (0 < (int)uVar4) {
    uVar19 = (ulong)uVar4;
  }
  lVar13 = (long)(int)uVar10;
  iVar46 = uVar4 * uVar10;
  iVar11 = iVar46 * 8;
  iVar38 = iVar46 * 2;
  iVar3 = iVar46 * 3;
  iVar21 = iVar46 * 7;
  lVar14 = lVar30 * 0x20;
  lVar45 = lVar30 * 4;
  iVar33 = iVar46 * 6;
  lVar15 = lVar30 * 0x10;
  iVar12 = iVar46 * 5;
  local_e4 = iVar46 * 4;
  lVar1 = lVar30 * 8;
  lVar2 = uVar19 * 4;
  for (uVar44 = 0; (long)(uVar44 | 7) < lVar24; uVar44 = uVar44 + 8) {
    lVar16 = lVar6 + (long)iVar21 * 4;
    lVar25 = lVar6 + (long)iVar33 * 4;
    lVar31 = lVar6 + (long)iVar12 * 4;
    lVar34 = lVar6 + (long)local_e4 * 4;
    lVar39 = lVar6 + (long)iVar3 * 4;
    lVar43 = lVar6 + (long)iVar38 * 4;
    lVar47 = lVar6 + (long)iVar46 * 4;
    lVar52 = lVar6 + (long)iVar51 * 4;
    pvVar22 = (void *)((uVar44 >> 3) * sVar7 * sVar8 + (long)pvVar9);
    lVar50 = 0;
    lVar29 = lVar52;
    local_130 = lVar43;
    local_128 = lVar16;
    local_120 = lVar25;
    local_118 = lVar31;
    local_110 = lVar34;
    local_108 = lVar39;
    local_f8 = lVar47;
    for (uVar41 = 0; (long)(uVar41 | 7) < lVar13; uVar41 = uVar41 + 8) {
      lVar28 = lVar50;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar37 = lVar28;
        for (lVar40 = 0; (int)lVar40 != 0x100; lVar40 = lVar40 + 0x20) {
          *(undefined4 *)((long)pvVar22 + lVar40) = *(undefined4 *)(lVar52 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 4) = *(undefined4 *)(lVar47 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 8) = *(undefined4 *)(lVar43 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 0xc) = *(undefined4 *)(lVar39 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 0x10) = *(undefined4 *)(lVar34 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 0x14) = *(undefined4 *)(lVar31 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 0x18) = *(undefined4 *)(lVar25 + lVar37);
          *(undefined4 *)((long)pvVar22 + lVar40 + 0x1c) = *(undefined4 *)(lVar16 + lVar37);
          lVar37 = lVar37 + lVar45;
        }
        lVar28 = lVar28 + 4;
        pvVar22 = (void *)((long)pvVar22 + lVar40);
      }
      lVar50 = lVar50 + lVar14;
      local_128 = local_128 + lVar14;
      local_120 = local_120 + lVar14;
      local_118 = local_118 + lVar14;
      local_110 = local_110 + lVar14;
      local_108 = local_108 + lVar14;
      local_130 = local_130 + lVar14;
      local_f8 = local_f8 + lVar14;
      lVar29 = lVar29 + lVar14;
    }
    for (; (long)(uVar41 | 3) < lVar13; uVar41 = uVar41 + 4) {
      lVar16 = lVar29;
      lVar25 = local_110;
      lVar31 = local_f8;
      lVar34 = local_130;
      lVar39 = local_108;
      lVar43 = local_120;
      lVar47 = local_128;
      lVar52 = local_118;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar50 = 0;
        for (lVar28 = 0; (int)lVar28 != 0x80; lVar28 = lVar28 + 0x20) {
          *(undefined4 *)((long)pvVar22 + lVar28) = *(undefined4 *)(lVar16 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 4) = *(undefined4 *)(lVar31 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 8) = *(undefined4 *)(lVar34 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0xc) = *(undefined4 *)(lVar39 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x10) = *(undefined4 *)(lVar25 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x14) = *(undefined4 *)(lVar52 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x18) = *(undefined4 *)(lVar43 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x1c) = *(undefined4 *)(lVar47 + lVar50);
          lVar50 = lVar50 + lVar45;
        }
        lVar47 = lVar47 + 4;
        lVar43 = lVar43 + 4;
        lVar52 = lVar52 + 4;
        lVar25 = lVar25 + 4;
        lVar39 = lVar39 + 4;
        lVar34 = lVar34 + 4;
        lVar31 = lVar31 + 4;
        lVar16 = lVar16 + 4;
        pvVar22 = (void *)((long)pvVar22 + lVar28);
      }
      local_128 = local_128 + lVar15;
      local_120 = local_120 + lVar15;
      local_118 = local_118 + lVar15;
      local_110 = local_110 + lVar15;
      local_108 = local_108 + lVar15;
      local_130 = local_130 + lVar15;
      local_f8 = local_f8 + lVar15;
      lVar29 = lVar29 + lVar15;
    }
    for (; (long)(uVar41 | 1) < lVar13; uVar41 = uVar41 + 2) {
      lVar16 = lVar29;
      lVar25 = local_110;
      lVar31 = local_128;
      lVar34 = local_120;
      lVar39 = local_118;
      lVar43 = local_130;
      lVar47 = local_f8;
      lVar52 = local_108;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar50 = 0;
        for (lVar28 = 0; (int)lVar28 != 0x40; lVar28 = lVar28 + 0x20) {
          *(undefined4 *)((long)pvVar22 + lVar28) = *(undefined4 *)(lVar16 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 4) = *(undefined4 *)(lVar47 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 8) = *(undefined4 *)(lVar43 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0xc) = *(undefined4 *)(lVar52 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x10) = *(undefined4 *)(lVar25 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x14) = *(undefined4 *)(lVar39 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x18) = *(undefined4 *)(lVar34 + lVar50);
          *(undefined4 *)((long)pvVar22 + lVar28 + 0x1c) = *(undefined4 *)(lVar31 + lVar50);
          lVar50 = lVar50 + lVar45;
        }
        lVar47 = lVar47 + 4;
        lVar43 = lVar43 + 4;
        lVar52 = lVar52 + 4;
        lVar25 = lVar25 + 4;
        lVar39 = lVar39 + 4;
        lVar34 = lVar34 + 4;
        lVar31 = lVar31 + 4;
        lVar16 = lVar16 + 4;
        pvVar22 = (void *)((long)pvVar22 + lVar28);
      }
      local_f8 = local_f8 + lVar1;
      local_130 = local_130 + lVar1;
      local_108 = local_108 + lVar1;
      local_110 = local_110 + lVar1;
      local_118 = local_118 + lVar1;
      local_120 = local_120 + lVar1;
      local_128 = local_128 + lVar1;
      lVar29 = lVar29 + lVar1;
    }
    for (; (long)uVar41 < lVar13; uVar41 = uVar41 + 1) {
      pvVar17 = pvVar22;
      for (lVar16 = 0; lVar2 != lVar16; lVar16 = lVar16 + 4) {
        *(undefined4 *)((long)pvVar22 + lVar16 * 8) = *(undefined4 *)(lVar29 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 4) = *(undefined4 *)(local_f8 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 8) = *(undefined4 *)(local_130 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 0xc) = *(undefined4 *)(local_108 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 0x10) = *(undefined4 *)(local_110 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 0x14) = *(undefined4 *)(local_118 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 0x18) = *(undefined4 *)(local_120 + lVar16);
        *(undefined4 *)((long)pvVar22 + lVar16 * 8 + 0x1c) = *(undefined4 *)(local_128 + lVar16);
        pvVar17 = (void *)((long)pvVar17 + 0x20);
      }
      local_128 = local_128 + lVar45;
      local_120 = local_120 + lVar45;
      local_118 = local_118 + lVar45;
      local_110 = local_110 + lVar45;
      local_108 = local_108 + lVar45;
      local_130 = local_130 + lVar45;
      local_f8 = local_f8 + lVar45;
      lVar29 = lVar29 + lVar45;
      pvVar22 = pvVar17;
    }
    iVar51 = iVar51 + iVar11;
    iVar46 = iVar46 + iVar11;
    iVar38 = iVar38 + iVar11;
    iVar3 = iVar3 + iVar11;
    iVar21 = iVar21 + iVar11;
    iVar33 = iVar33 + iVar11;
    iVar12 = iVar12 + iVar11;
    local_e4 = local_e4 + iVar11;
  }
  lVar6 = *(long *)(&this->field_0x148 + (long)p_Var5);
  sVar7 = (this->weight_data_tm).elemsize;
  sVar8 = (this->weight_data_tm).cstep;
  pvVar9 = (this->weight_data_tm).data;
  iVar12 = uVar4 * uVar10 * 4;
  for (; (long)(uVar44 | 3) < lVar24; uVar44 = uVar44 + 4) {
    lVar16 = lVar6 + (long)iVar51 * 4;
    lVar25 = lVar6 + (long)iVar46 * 4;
    lVar31 = lVar6 + (long)iVar38 * 4;
    lVar34 = lVar6 + (long)iVar3 * 4;
    puVar26 = (undefined4 *)
              ((ulong)(((uint)(uVar44 >> 3) & 0x1fffffff) + (uint)(((uint)uVar44 >> 2 & 1) != 0)) *
               sVar7 * sVar8 + (long)pvVar9);
    lVar29 = 0;
    lVar39 = lVar34;
    lVar43 = lVar25;
    lVar47 = lVar16;
    lVar52 = lVar31;
    for (uVar41 = 0; (long)(uVar41 | 7) < lVar13; uVar41 = uVar41 + 8) {
      lVar50 = lVar29;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar28 = lVar50;
        for (lVar37 = 0; (int)lVar37 != 0x80; lVar37 = lVar37 + 0x10) {
          *(undefined4 *)((long)puVar26 + lVar37) = *(undefined4 *)(lVar16 + lVar28);
          *(undefined4 *)((long)puVar26 + lVar37 + 4) = *(undefined4 *)(lVar25 + lVar28);
          *(undefined4 *)((long)puVar26 + lVar37 + 8) = *(undefined4 *)(lVar31 + lVar28);
          *(undefined4 *)((long)puVar26 + lVar37 + 0xc) = *(undefined4 *)(lVar34 + lVar28);
          lVar28 = lVar28 + lVar45;
        }
        puVar26 = (undefined4 *)((long)puVar26 + lVar37);
        lVar50 = lVar50 + 4;
      }
      lVar29 = lVar29 + lVar14;
      lVar47 = lVar47 + lVar14;
      lVar43 = lVar43 + lVar14;
      lVar52 = lVar52 + lVar14;
      lVar39 = lVar39 + lVar14;
    }
    for (; (long)(uVar41 | 3) < lVar13; uVar41 = uVar41 + 4) {
      lVar16 = lVar39;
      lVar25 = lVar52;
      lVar31 = lVar43;
      lVar34 = lVar47;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar50 = 0;
        for (lVar29 = 0; (int)lVar29 != 0x40; lVar29 = lVar29 + 0x10) {
          *(undefined4 *)((long)puVar26 + lVar29) = *(undefined4 *)(lVar34 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 4) = *(undefined4 *)(lVar31 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 8) = *(undefined4 *)(lVar25 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 0xc) = *(undefined4 *)(lVar16 + lVar50);
          lVar50 = lVar50 + lVar45;
        }
        puVar26 = (undefined4 *)((long)puVar26 + lVar29);
        lVar34 = lVar34 + 4;
        lVar31 = lVar31 + 4;
        lVar25 = lVar25 + 4;
        lVar16 = lVar16 + 4;
      }
      lVar47 = lVar47 + lVar15;
      lVar43 = lVar43 + lVar15;
      lVar52 = lVar52 + lVar15;
      lVar39 = lVar39 + lVar15;
    }
    for (; (long)(uVar41 | 1) < lVar13; uVar41 = uVar41 + 2) {
      lVar16 = lVar39;
      lVar25 = lVar52;
      lVar31 = lVar43;
      lVar34 = lVar47;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar50 = 0;
        for (lVar29 = 0; (int)lVar29 != 0x20; lVar29 = lVar29 + 0x10) {
          *(undefined4 *)((long)puVar26 + lVar29) = *(undefined4 *)(lVar34 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 4) = *(undefined4 *)(lVar31 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 8) = *(undefined4 *)(lVar25 + lVar50);
          *(undefined4 *)((long)puVar26 + lVar29 + 0xc) = *(undefined4 *)(lVar16 + lVar50);
          lVar50 = lVar50 + lVar45;
        }
        puVar26 = (undefined4 *)((long)puVar26 + lVar29);
        lVar34 = lVar34 + 4;
        lVar31 = lVar31 + 4;
        lVar25 = lVar25 + 4;
        lVar16 = lVar16 + 4;
      }
      lVar47 = lVar47 + lVar1;
      lVar43 = lVar43 + lVar1;
      lVar52 = lVar52 + lVar1;
      lVar39 = lVar39 + lVar1;
    }
    for (; (long)uVar41 < lVar13; uVar41 = uVar41 + 1) {
      for (uVar49 = 0; uVar19 != uVar49; uVar49 = uVar49 + 1) {
        *puVar26 = *(undefined4 *)(lVar47 + uVar49 * 4);
        puVar26[1] = *(undefined4 *)(lVar43 + uVar49 * 4);
        puVar26[2] = *(undefined4 *)(lVar52 + uVar49 * 4);
        puVar26[3] = *(undefined4 *)(lVar39 + uVar49 * 4);
        puVar26 = puVar26 + 4;
      }
      lVar39 = lVar39 + lVar45;
      lVar52 = lVar52 + lVar45;
      lVar43 = lVar43 + lVar45;
      lVar47 = lVar47 + lVar45;
    }
    iVar51 = iVar51 + iVar12;
    iVar46 = iVar46 + iVar12;
    iVar38 = iVar38 + iVar12;
    iVar3 = iVar3 + iVar12;
  }
  lVar47 = *(long *)(&this->field_0x148 + (long)p_Var5);
  pvVar9 = (this->weight_data_tm).data;
  sVar7 = (this->weight_data_tm).elemsize;
  sVar8 = (this->weight_data_tm).cstep;
  iVar3 = uVar4 * uVar10 * 2;
  lVar6 = lVar47 + (long)(int)(uVar4 * 7) * 4;
  lVar16 = lVar47 + (long)(int)(uVar4 * 6) * 4;
  lVar25 = lVar47 + (long)(int)(uVar4 * 5) * 4;
  lVar31 = lVar47 + (long)(int)(uVar4 * 4) * 4;
  lVar34 = lVar47 + (long)(int)(uVar4 * 3) * 4;
  lVar39 = lVar47 + (long)(int)(uVar4 * 2) * 4;
  lVar43 = lVar47 + lVar30 * 4;
  for (; (long)(uVar44 | 1) < lVar24; uVar44 = uVar44 + 2) {
    lVar28 = (long)iVar46;
    local_130 = lVar6 + lVar28 * 4;
    local_108 = lVar16 + lVar28 * 4;
    local_110 = lVar25 + lVar28 * 4;
    local_118 = lVar31 + lVar28 * 4;
    lVar52 = lVar34 + lVar28 * 4;
    lVar29 = lVar39 + lVar28 * 4;
    lVar50 = lVar43 + lVar28 * 4;
    lVar28 = lVar47 + lVar28 * 4;
    lVar35 = (long)iVar51;
    local_120 = lVar6 + lVar35 * 4;
    local_128 = lVar16 + lVar35 * 4;
    lVar37 = lVar25 + lVar35 * 4;
    lVar40 = lVar31 + lVar35 * 4;
    lVar23 = lVar34 + lVar35 * 4;
    lVar42 = lVar39 + lVar35 * 4;
    lVar18 = lVar43 + lVar35 * 4;
    lVar35 = lVar47 + lVar35 * 4;
    puVar26 = (undefined4 *)
              ((ulong)(((uint)(uVar44 >> 2) & 1) + ((uint)(uVar44 >> 3) & 0x1fffffff) +
                      (uint)(((uint)uVar44 >> 1 & 1) != 0)) * sVar7 * sVar8 + (long)pvVar9);
    for (uVar41 = 0; (long)(uVar41 | 7) < lVar13; uVar41 = uVar41 + 8) {
      for (lVar36 = 0; lVar2 != lVar36; lVar36 = lVar36 + 4) {
        *puVar26 = *(undefined4 *)(lVar35 + lVar36);
        puVar26[1] = *(undefined4 *)(lVar18 + lVar36);
        puVar26[2] = *(undefined4 *)(lVar42 + lVar36);
        puVar26[3] = *(undefined4 *)(lVar23 + lVar36);
        puVar26[4] = *(undefined4 *)(lVar40 + lVar36);
        puVar26[5] = *(undefined4 *)(lVar37 + lVar36);
        puVar26[6] = *(undefined4 *)(local_128 + lVar36);
        puVar26[7] = *(undefined4 *)(local_120 + lVar36);
        puVar26[8] = *(undefined4 *)(lVar28 + lVar36);
        puVar26[9] = *(undefined4 *)(lVar50 + lVar36);
        puVar26[10] = *(undefined4 *)(lVar29 + lVar36);
        puVar26[0xb] = *(undefined4 *)(lVar52 + lVar36);
        puVar26[0xc] = *(undefined4 *)(local_118 + lVar36);
        puVar26[0xd] = *(undefined4 *)(local_110 + lVar36);
        puVar26[0xe] = *(undefined4 *)(local_108 + lVar36);
        puVar26[0xf] = *(undefined4 *)(local_130 + lVar36);
        puVar26 = puVar26 + 0x10;
      }
      local_130 = local_130 + lVar14;
      local_108 = local_108 + lVar14;
      local_110 = local_110 + lVar14;
      local_118 = local_118 + lVar14;
      lVar52 = lVar52 + lVar14;
      lVar29 = lVar29 + lVar14;
      lVar50 = lVar50 + lVar14;
      lVar28 = lVar28 + lVar14;
      local_120 = local_120 + lVar14;
      local_128 = local_128 + lVar14;
      lVar37 = lVar37 + lVar14;
      lVar40 = lVar40 + lVar14;
      lVar23 = lVar23 + lVar14;
      lVar42 = lVar42 + lVar14;
      lVar18 = lVar18 + lVar14;
      lVar35 = lVar35 + lVar14;
    }
    for (; (long)(uVar41 | 3) < lVar13; uVar41 = uVar41 + 4) {
      puVar27 = puVar26;
      for (lVar37 = 0; lVar2 != lVar37; lVar37 = lVar37 + 4) {
        puVar26[lVar37 * 2] = *(undefined4 *)(lVar35 + lVar37);
        puVar26[lVar37 * 2 + 1] = *(undefined4 *)(lVar18 + lVar37);
        puVar26[lVar37 * 2 + 2] = *(undefined4 *)(lVar42 + lVar37);
        puVar26[lVar37 * 2 + 3] = *(undefined4 *)(lVar23 + lVar37);
        puVar26[lVar37 * 2 + 4] = *(undefined4 *)(lVar28 + lVar37);
        puVar26[lVar37 * 2 + 5] = *(undefined4 *)(lVar50 + lVar37);
        puVar26[lVar37 * 2 + 6] = *(undefined4 *)(lVar29 + lVar37);
        puVar26[lVar37 * 2 + 7] = *(undefined4 *)(lVar52 + lVar37);
        puVar27 = puVar27 + 8;
      }
      lVar52 = lVar52 + lVar15;
      lVar29 = lVar29 + lVar15;
      lVar50 = lVar50 + lVar15;
      lVar28 = lVar28 + lVar15;
      lVar23 = lVar23 + lVar15;
      lVar42 = lVar42 + lVar15;
      lVar18 = lVar18 + lVar15;
      lVar35 = lVar35 + lVar15;
      puVar26 = puVar27;
    }
    for (; (long)(uVar41 | 1) < lVar13; uVar41 = uVar41 + 2) {
      lVar52 = lVar28;
      lVar29 = lVar35;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        lVar37 = 0;
        for (lVar50 = 0; (int)lVar50 != 0x10; lVar50 = lVar50 + 8) {
          *(undefined4 *)((long)puVar26 + lVar50) = *(undefined4 *)(lVar29 + lVar37);
          *(undefined4 *)((long)puVar26 + lVar50 + 4) = *(undefined4 *)(lVar52 + lVar37);
          lVar37 = lVar37 + lVar45;
        }
        puVar26 = (undefined4 *)((long)puVar26 + lVar50);
        lVar29 = lVar29 + 4;
        lVar52 = lVar52 + 4;
      }
      lVar35 = lVar35 + lVar1;
      lVar28 = lVar28 + lVar1;
    }
    for (; (long)uVar41 < lVar13; uVar41 = uVar41 + 1) {
      for (uVar49 = 0; uVar19 != uVar49; uVar49 = uVar49 + 1) {
        *puVar26 = *(undefined4 *)(lVar35 + uVar49 * 4);
        puVar26[1] = *(undefined4 *)(lVar28 + uVar49 * 4);
        puVar26 = puVar26 + 2;
      }
      lVar28 = lVar28 + lVar45;
      lVar35 = lVar35 + lVar45;
    }
    iVar51 = iVar51 + iVar3;
    iVar46 = iVar46 + iVar3;
  }
  lVar6 = *(long *)(&this->field_0x148 + (long)p_Var5);
  pvVar9 = (this->weight_data_tm).data;
  sVar7 = (this->weight_data_tm).elemsize;
  sVar8 = (this->weight_data_tm).cstep;
  for (; (long)uVar44 < lVar24; uVar44 = uVar44 + 1) {
    lVar45 = lVar6 + lVar30 * 4 + (long)iVar51 * 4;
    puVar26 = (undefined4 *)(lVar6 + (long)iVar51 * 4);
    puVar27 = (undefined4 *)
              ((ulong)(((uint)uVar44 & 1) + ((uint)(uVar44 >> 3) & 0x1fffffff) +
                       ((uint)(uVar44 >> 2) & 1) + (uint)(((uint)uVar44 >> 1 & 1) != 0)) *
               sVar7 * sVar8 + (long)pvVar9);
    for (uVar41 = 0; (long)(uVar41 | 7) < lVar13; uVar41 = uVar41 + 8) {
      puVar32 = puVar26;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        puVar48 = puVar32;
        for (lVar16 = 0; (int)lVar16 != 0x20; lVar16 = lVar16 + 4) {
          *(undefined4 *)((long)puVar27 + lVar16) = *puVar48;
          puVar48 = puVar48 + lVar30;
        }
        puVar27 = (undefined4 *)((long)puVar27 + lVar16);
        puVar32 = puVar32 + 1;
      }
      puVar26 = puVar26 + lVar30 * 8;
      lVar45 = lVar45 + lVar14;
    }
    for (; (long)(uVar41 | 3) < lVar13; uVar41 = uVar41 + 4) {
      puVar32 = puVar26;
      for (uVar49 = 0; uVar49 != uVar19; uVar49 = uVar49 + 1) {
        puVar48 = puVar32;
        for (lVar16 = 0; (int)lVar16 != 0x10; lVar16 = lVar16 + 4) {
          *(undefined4 *)((long)puVar27 + lVar16) = *puVar48;
          puVar48 = puVar48 + lVar30;
        }
        puVar27 = (undefined4 *)((long)puVar27 + lVar16);
        puVar32 = puVar32 + 1;
      }
      puVar26 = puVar26 + lVar30 * 4;
      lVar45 = lVar45 + lVar15;
    }
    for (; (long)(uVar41 | 1) < lVar13; uVar41 = uVar41 + 2) {
      for (uVar49 = 0; uVar19 != uVar49; uVar49 = uVar49 + 1) {
        *puVar27 = puVar26[uVar49];
        puVar27[1] = *(undefined4 *)(lVar45 + uVar49 * 4);
        puVar27 = puVar27 + 2;
      }
      lVar45 = lVar45 + lVar1;
      puVar26 = puVar26 + lVar30 * 2;
    }
    for (; (long)uVar41 < lVar13; uVar41 = uVar41 + 1) {
      for (lVar45 = 0; lVar2 != lVar45; lVar45 = lVar45 + 4) {
        *(undefined4 *)((long)puVar27 + lVar45) = *(undefined4 *)((long)puVar26 + lVar45);
      }
      puVar26 = puVar26 + lVar30;
      puVar27 = (undefined4 *)((long)puVar27 + lVar45);
    }
    iVar51 = iVar51 + uVar10 * uVar4;
  }
  return 0;
}

Assistant:

int Convolution1D_x86_fma::create_pipeline(const Option& /*opt*/)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    convolution1d_transform_kernel_packed(weight_data, weight_data_tm, num_input, num_output, kernel_w);

    return 0;
}